

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O0

planck_unit_suite_t * cpp_wrapper2_getsuite_1(void)

{
  planck_unit_suite_t *suite_00;
  planck_unit_suite_t *suite;
  
  suite_00 = planck_unit_new_suite();
  planck_unit_add_to_suite
            (suite_00,test_cpp_wrapper_setup_all,"test_cpp_wrapper_setup_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
            );
  planck_unit_add_to_suite
            (suite_00,test_cpp_wrapper_insert_single_all,"test_cpp_wrapper_insert_single_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
            );
  planck_unit_add_to_suite
            (suite_00,test_cpp_wrapper_insert_multiple_all,"test_cpp_wrapper_insert_multiple_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
            );
  planck_unit_add_to_suite
            (suite_00,test_cpp_wrapper_get_single_all,"test_cpp_wrapper_get_single_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
            );
  planck_unit_add_to_suite
            (suite_00,test_cpp_wrapper_get_in_many_all,"test_cpp_wrapper_get_in_many_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
            );
  planck_unit_add_to_suite
            (suite_00,test_cpp_wrapper_get_lots_all,"test_cpp_wrapper_get_lots_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
            );
  return suite_00;
}

Assistant:

planck_unit_suite_t *
cpp_wrapper2_getsuite_1(
) {
	planck_unit_suite_t *suite = planck_unit_new_suite();

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_setup_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_insert_single_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_insert_multiple_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_get_single_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_get_in_many_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_get_lots_all);

	return suite;
}